

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::convertUToF32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary<4,_&wasm::Literal::getLanesI32x4,_&wasm::Literal::convertUIToF32>
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::convertUToF32x4() const {
  return unary<4, &Literal::getLanesI32x4, &Literal::convertUIToF32>(*this);
}